

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImStrnicmp(char *str1,char *str2,size_t count)

{
  char cVar1;
  char cVar2;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  int d;
  int local_1c;
  long local_18;
  char *local_10;
  char *local_8;
  
  local_1c = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    bVar3 = false;
    if (local_18 != 0) {
      cVar1 = ImToUpper(*local_10);
      cVar2 = ImToUpper(*local_8);
      local_1c = (int)cVar1 - (int)cVar2;
      bVar3 = false;
      if (local_1c == 0) {
        bVar3 = *local_8 != '\0';
      }
    }
    if (!bVar3) break;
    local_8 = local_8 + 1;
    local_10 = local_10 + 1;
    local_18 = local_18 + -1;
  }
  return local_1c;
}

Assistant:

int ImStrnicmp(const char* str1, const char* str2, size_t count)
{
    int d = 0;
    while (count > 0 && (d = ImToUpper(*str2) - ImToUpper(*str1)) == 0 && *str1) { str1++; str2++; count--; }
    return d;
}